

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::setupAttribute
          (vertexArrayObjectDefinition *this,attributeDefinition *attribute,
          bufferCollection *buffers,GLuint program_id)

{
  glGetAttribLocationFunc p_Var1;
  undefined4 uVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLchar *pGVar5;
  sockaddr *__addr;
  GLint attribute_location;
  GLenum type;
  GLuint n_components;
  bufferDefinition *buffer;
  allocator<char> local_49;
  string local_48 [8];
  string attribute_name;
  GLuint program_id_local;
  bufferCollection *buffers_local;
  attributeDefinition *attribute_local;
  vertexArrayObjectDefinition *this_local;
  
  attribute_name.field_2._12_4_ = program_id;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"vs_in_",&local_49);
  std::allocator<char>::~allocator(&local_49);
  _type = (bufferCollection *)0x0;
  attribute_location = 0;
  std::__cxx11::string::append((char *)local_48);
  uVar2 = attribute_name.field_2._12_4_;
  switch(attribute->attribute_id) {
  case Position:
    attribute_location = 4;
    _type = buffers;
    break;
  case TextureCoordinates:
    attribute_location = 4;
    _type = (bufferCollection *)&buffers->texture_coordinate;
    break;
  case TextureCoordinatesForGather:
    attribute_location = 4;
    _type = (bufferCollection *)&buffers->texture_coordinate_for_gather;
    break;
  case Lod:
    attribute_location = 1;
    _type = (bufferCollection *)&buffers->lod;
    break;
  case GradX:
    attribute_location = 4;
    _type = (bufferCollection *)&buffers->grad_x;
    break;
  case GradY:
    attribute_location = 4;
    _type = (bufferCollection *)&buffers->grad_y;
    break;
  case RefZ:
    attribute_location = 1;
    _type = (bufferCollection *)&buffers->refZ;
  }
  p_Var1 = this->m_gl->getAttribLocation;
  pGVar5 = (GLchar *)std::__cxx11::string::c_str();
  GVar3 = (*p_Var1)(uVar2,pGVar5);
  if ((GVar3 != 0xffffffff) && (GVar4 = (*this->m_gl->getError)(), GVar4 == 0)) {
    bufferDefinition::bind(&_type->postion,0x8892,__addr,0);
    (*this->m_gl->enableVertexAttribArray)(GVar3);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"Failed to enable attribute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x1428);
    (*this->m_gl->vertexAttribPointer)(GVar3,attribute_location,0x1406,'\0',0,(void *)0x0);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"Failed to setup vertex attribute arrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x142c);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::setupAttribute(const attributeDefinition& attribute,
																				  const bufferCollection&	buffers,
																				  glw::GLuint				 program_id)
{
	std::string				attribute_name = vertex_shader_input;
	const bufferDefinition* buffer		   = 0;
	glw::GLuint				n_components   = 0;
	glw::GLenum				type		   = GL_FLOAT;

	attribute_name.append(attribute.name);

	switch (attribute.attribute_id)
	{
	case Position:
		n_components = 4;
		buffer		 = &buffers.postion;
		break;
	case TextureCoordinates:
		n_components = 4;
		buffer		 = &buffers.texture_coordinate;
		break;
	case TextureCoordinatesForGather:
		n_components = 4;
		buffer		 = &buffers.texture_coordinate_for_gather;
		break;
	case Lod:
		n_components = 1;
		buffer		 = &buffers.lod;
		break;
	case GradX:
		n_components = 4;
		buffer		 = &buffers.grad_x;
		break;
	case GradY:
		n_components = 4;
		buffer		 = &buffers.grad_y;
		break;
	case RefZ:
		n_components = 1;
		buffer		 = &buffers.refZ;
		break;
	}

	/* Get attribute location */
	glw::GLint attribute_location = m_gl->getAttribLocation(program_id, attribute_name.c_str());

	if ((m_invalid_attribute_location == (glw::GLuint)attribute_location) || (GL_NO_ERROR != m_gl->getError()))
	{
		//throw tcu::InternalError("Failed to get location of attribute:", attribute_name.c_str(), __FILE__, __LINE__);
		return;
	}

	buffer->bind(GL_ARRAY_BUFFER);

	m_gl->enableVertexAttribArray(attribute_location);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to enable attribute");

	m_gl->vertexAttribPointer(attribute_location, n_components, type, GL_FALSE, 0 /* stride */, 0 /* offset */);

	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to setup vertex attribute arrays");
}